

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::sampleCubeArraySeamless
          (tcu *this,ConstPixelBufferAccess *levels,int numLevels,int slice,CubeFace face,
          Sampler *sampler,float s,float t,float lod)

{
  int iVar1;
  int iVar2;
  int levelNdx;
  bool bVar3;
  float fVar4;
  undefined8 extraout_XMM0_Qa;
  ulong uVar5;
  Vector<float,_4> VVar6;
  Vec4 VVar7;
  ConstPixelBufferAccess *local_5e8;
  ConstPixelBufferAccess *local_5d0;
  ConstPixelBufferAccess *local_5b8;
  ConstPixelBufferAccess *local_5a0;
  FilterMode local_58c;
  Vector<float,_4> local_570;
  Vector<float,_4> local_560;
  tcu local_550 [8];
  float local_548 [2];
  tcu local_540 [16];
  ConstPixelBufferAccess local_530;
  ConstPixelBufferAccess local_508;
  CubeFace local_4dc;
  undefined1 local_4d8 [4];
  int i_2;
  ConstPixelBufferAccess faceAccesses1 [6];
  ConstPixelBufferAccess faceAccesses0 [6];
  tcu local_2ec [8];
  float local_2e4 [2];
  tcu local_2dc [16];
  undefined1 local_2cc [8];
  Vec4 t1;
  Vec4 t0;
  float f;
  FilterMode levelFilter_1;
  int level1;
  int level0;
  int maxLevel_1;
  CubeFace local_26c;
  undefined1 local_268 [4];
  int i_1;
  ConstPixelBufferAccess faceAccesses_1 [6];
  FilterMode levelFilter;
  int level;
  int maxLevel;
  CubeFace local_13c;
  undefined1 local_138 [4];
  int i;
  ConstPixelBufferAccess faceAccesses [6];
  FilterMode filterMode;
  bool magnified;
  int faceDepth;
  float lod_local;
  float t_local;
  float s_local;
  Sampler *sampler_local;
  CubeFace face_local;
  int slice_local;
  int numLevels_local;
  ConstPixelBufferAccess *levels_local;
  undefined1 auVar8 [12];
  undefined8 uVar9;
  
  iVar1 = getCubeArrayFaceIndex(face);
  iVar1 = slice * 6 + iVar1;
  uVar5 = (ulong)(uint)lod;
  faceAccesses[5].m_data._7_1_ = lod <= sampler->lodThreshold;
  if ((bool)faceAccesses[5].m_data._7_1_) {
    local_58c = sampler->magFilter;
  }
  else {
    local_58c = sampler->minFilter;
  }
  faceAccesses[5].m_data._0_4_ = local_58c;
  switch(local_58c) {
  case NEAREST:
    VVar6.m_data = (float  [4])sampleCubeSeamlessNearest(this,levels,sampler,s,t,iVar1);
    break;
  case LINEAR:
    local_5a0 = (ConstPixelBufferAccess *)local_138;
    do {
      ConstPixelBufferAccess::ConstPixelBufferAccess(local_5a0);
      local_5a0 = local_5a0 + 1;
    } while (local_5a0 != (ConstPixelBufferAccess *)&faceAccesses[5].m_data);
    for (local_13c = CUBEFACE_NEGATIVE_X; (int)local_13c < 6;
        local_13c = local_13c + CUBEFACE_POSITIVE_X) {
      getCubeArrayFaceAccess((ConstPixelBufferAccess *)&level,levels,0,slice,local_13c);
      memcpy(local_138 + (long)(int)local_13c * 0x28,&level,0x28);
    }
    VVar6.m_data = (float  [4])
                   sampleCubeSeamlessLinear
                             (this,(ConstPixelBufferAccess (*) [6])local_138,face,sampler,s,t,0);
    break;
  case NEAREST_MIPMAP_NEAREST:
  case LINEAR_MIPMAP_NEAREST:
    fVar4 = deFloatCeil(lod + 0.5);
    iVar2 = deClamp32((int)fVar4 + -1,0,numLevels + -1);
    faceAccesses_1[5].m_data._4_4_ =
         (uint)((FilterMode)faceAccesses[5].m_data == LINEAR_MIPMAP_NEAREST);
    if (faceAccesses_1[5].m_data._4_4_ == 0) {
      VVar6.m_data = (float  [4])sampleCubeSeamlessNearest(this,levels + iVar2,sampler,s,t,iVar1);
    }
    else {
      local_5b8 = (ConstPixelBufferAccess *)local_268;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess(local_5b8);
        local_5b8 = local_5b8 + 1;
      } while (local_5b8 != (ConstPixelBufferAccess *)&faceAccesses_1[5].m_data);
      for (local_26c = CUBEFACE_NEGATIVE_X; (int)local_26c < 6;
          local_26c = local_26c + CUBEFACE_POSITIVE_X) {
        getCubeArrayFaceAccess((ConstPixelBufferAccess *)&level0,levels,iVar2,slice,local_26c);
        memcpy(local_268 + (long)(int)local_26c * 0x28,&level0,0x28);
      }
      VVar6.m_data = (float  [4])
                     sampleCubeSeamlessLinear
                               (this,(ConstPixelBufferAccess (*) [6])local_268,face,sampler,s,t,0);
    }
    break;
  case NEAREST_MIPMAP_LINEAR:
  case LINEAR_MIPMAP_LINEAR:
    fVar4 = ::deFloatFloor(lod);
    iVar2 = deClamp32((int)fVar4,0,numLevels + -1);
    levelNdx = de::min<int>(numLevels + -1,iVar2 + 1);
    bVar3 = (FilterMode)faceAccesses[5].m_data == LINEAR_MIPMAP_LINEAR;
    fVar4 = deFloatFrac(lod);
    Vector<float,_4>::Vector((Vector<float,_4> *)(t1.m_data + 2));
    Vector<float,_4>::Vector((Vector<float,_4> *)local_2cc);
    if (bVar3) {
      local_5d0 = (ConstPixelBufferAccess *)&faceAccesses1[5].m_data;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess(local_5d0);
        local_5d0 = local_5d0 + 1;
      } while (local_5d0 != (ConstPixelBufferAccess *)&faceAccesses0[5].m_data);
      local_5e8 = (ConstPixelBufferAccess *)local_4d8;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess(local_5e8);
        local_5e8 = local_5e8 + 1;
      } while (local_5e8 != (ConstPixelBufferAccess *)&faceAccesses1[5].m_data);
      for (local_4dc = CUBEFACE_NEGATIVE_X; (int)local_4dc < 6;
          local_4dc = local_4dc + CUBEFACE_POSITIVE_X) {
        getCubeArrayFaceAccess(&local_508,levels,iVar2,slice,local_4dc);
        memcpy(&faceAccesses1[(long)(int)local_4dc + 5].m_data,&local_508,0x28);
        getCubeArrayFaceAccess(&local_530,levels,levelNdx,slice,local_4dc);
        memcpy(local_4d8 + (long)(int)local_4dc * 0x28,&local_530,0x28);
      }
      sampleCubeSeamlessLinear
                (local_540,(ConstPixelBufferAccess (*) [6])&faceAccesses1[5].m_data,face,sampler,s,t
                 ,0);
      t1.m_data._8_8_ = local_540._0_8_;
      sampleCubeSeamlessLinear
                (local_550,(ConstPixelBufferAccess (*) [6])local_4d8,face,sampler,s,t,0);
      local_2cc[0] = local_550[0];
      local_2cc[1] = local_550[1];
      local_2cc[2] = local_550[2];
      local_2cc[3] = local_550[3];
      local_2cc[4] = local_550[4];
      local_2cc[5] = local_550[5];
      local_2cc[6] = local_550[6];
      local_2cc[7] = local_550[7];
      t1.m_data[0] = local_548[0];
      t1.m_data[1] = local_548[1];
    }
    else {
      sampleCubeSeamlessNearest(local_2dc,levels + iVar2,sampler,s,t,iVar1);
      t1.m_data._8_8_ = local_2dc._0_8_;
      sampleCubeSeamlessNearest(local_2ec,levels + levelNdx,sampler,s,t,iVar1);
      local_2cc[0] = local_2ec[0];
      local_2cc[1] = local_2ec[1];
      local_2cc[2] = local_2ec[2];
      local_2cc[3] = local_2ec[3];
      local_2cc[4] = local_2ec[4];
      local_2cc[5] = local_2ec[5];
      local_2cc[6] = local_2ec[6];
      local_2cc[7] = local_2ec[7];
      t1.m_data[0] = local_2e4[0];
      t1.m_data[1] = local_2e4[1];
    }
    operator*((tcu *)&local_560,(Vector<float,_4> *)(t1.m_data + 2),1.0 - fVar4);
    operator*((tcu *)&local_570,(Vector<float,_4> *)local_2cc,fVar4);
    VVar6 = operator+(this,&local_560,&local_570);
    break;
  default:
    Vector<float,_4>::Vector((Vector<float,_4> *)this,0.0);
    VVar6.m_data[2] = (float)(int)uVar5;
    VVar6.m_data[3] = (float)(int)(uVar5 >> 0x20);
    VVar6.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar6.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  VVar7.m_data[0] = VVar6.m_data[0];
  auVar8._4_4_ = VVar6.m_data[1];
  register0x00001240 = VVar6.m_data[2];
  register0x00001244 = VVar6.m_data[3];
  return (Vec4)VVar7.m_data;
}

Assistant:

static Vec4 sampleCubeArraySeamless (const ConstPixelBufferAccess* const levels, int numLevels, int slice, CubeFace face, const Sampler& sampler, float s, float t, float lod)
{
	const int					faceDepth	= (slice * 6) + getCubeArrayFaceIndex(face);
	const bool					magnified	= lod <= sampler.lodThreshold;
	const Sampler::FilterMode	filterMode	= magnified ? sampler.magFilter : sampler.minFilter;

	switch (filterMode)
	{
		case Sampler::NEAREST:
			return sampleCubeSeamlessNearest(levels[0], sampler, s, t, faceDepth);

		case Sampler::LINEAR:
		{
			ConstPixelBufferAccess faceAccesses[CUBEFACE_LAST];
			for (int i = 0; i < (int)CUBEFACE_LAST; i++)
				faceAccesses[i] = getCubeArrayFaceAccess(levels, 0, slice, (CubeFace)i);

			return sampleCubeSeamlessLinear(faceAccesses, face, sampler, s, t, 0);
		}

		case Sampler::NEAREST_MIPMAP_NEAREST:
		case Sampler::LINEAR_MIPMAP_NEAREST:
		{
			int						maxLevel	= (int)numLevels-1;
			int						level		= deClamp32((int)deFloatCeil(lod + 0.5f) - 1, 0, maxLevel);
			Sampler::FilterMode		levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_NEAREST) ? Sampler::LINEAR : Sampler::NEAREST;

			if (levelFilter == Sampler::NEAREST)
				return sampleCubeSeamlessNearest(levels[level], sampler, s, t, faceDepth);
			else
			{
				DE_ASSERT(levelFilter == Sampler::LINEAR);

				ConstPixelBufferAccess faceAccesses[CUBEFACE_LAST];
				for (int i = 0; i < (int)CUBEFACE_LAST; i++)
					faceAccesses[i] = getCubeArrayFaceAccess(levels, level, slice, (CubeFace)i);

				return sampleCubeSeamlessLinear(faceAccesses, face, sampler, s, t, 0);
			}
		}

		case Sampler::NEAREST_MIPMAP_LINEAR:
		case Sampler::LINEAR_MIPMAP_LINEAR:
		{
			int						maxLevel	= (int)numLevels-1;
			int						level0		= deClamp32((int)deFloatFloor(lod), 0, maxLevel);
			int						level1		= de::min(maxLevel, level0 + 1);
			Sampler::FilterMode		levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_LINEAR) ? Sampler::LINEAR : Sampler::NEAREST;
			float					f			= deFloatFrac(lod);
			Vec4					t0;
			Vec4					t1;

			if (levelFilter == Sampler::NEAREST)
			{
				t0 = sampleCubeSeamlessNearest(levels[level0], sampler, s, t, faceDepth);
				t1 = sampleCubeSeamlessNearest(levels[level1], sampler, s, t, faceDepth);
			}
			else
			{
				DE_ASSERT(levelFilter == Sampler::LINEAR);

				ConstPixelBufferAccess faceAccesses0[CUBEFACE_LAST];
				ConstPixelBufferAccess faceAccesses1[CUBEFACE_LAST];
				for (int i = 0; i < (int)CUBEFACE_LAST; i++)
				{
					faceAccesses0[i] = getCubeArrayFaceAccess(levels, level0, slice, (CubeFace)i);
					faceAccesses1[i] = getCubeArrayFaceAccess(levels, level1, slice, (CubeFace)i);
				}

				t0 = sampleCubeSeamlessLinear(faceAccesses0, face, sampler, s, t, 0);
				t1 = sampleCubeSeamlessLinear(faceAccesses1, face, sampler, s, t, 0);
			}

			return t0*(1.0f - f) + t1*f;
		}

		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}